

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall helics::apps::Player::runTo(Player *this,Time stopTime_input)

{
  char cVar1;
  element_type *peVar2;
  long lVar3;
  _func_int *p_Var4;
  bool bVar5;
  ostream *poVar6;
  pointer pVVar7;
  pointer pMVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  Federate *this_00;
  Time TVar13;
  bool bVar14;
  int iteration;
  
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cVar1 = *(char *)((long)&(peVar2->super_ValueFederate).vfManager._M_t.
                           super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                           .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>.
                           _M_head_impl +
                   (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
  if (cVar1 == '\0') {
    (*(this->super_App)._vptr_App[2])(this);
  }
  if (cVar1 < '\x02') {
    sendInformation(this,(Time)0xffffffffffffffff,0);
    peVar2 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    Federate::enterExecutingMode
              ((Federate *)
               ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
               (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),NO_ITERATIONS);
    sendInformation(this,(Time)0x0,0);
  }
  else {
    peVar2 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pVVar7 = (this->points).
             super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = *(long *)(&(peVar2->super_ValueFederate).field_0x28 +
                      (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
    uVar9 = (long)(this->points).
                  super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar7 >> 7;
    if (this->pointIndex < uVar9) {
      uVar10 = this->pointIndex;
      pVVar7 = pVVar7 + uVar10;
      do {
        if (lVar12 < (pVVar7->time).internalTimeCode) break;
        uVar10 = uVar10 + 1;
        this->pointIndex = uVar10;
        pVVar7 = pVVar7 + 1;
      } while (uVar10 < uVar9);
    }
    pMVar8 = (this->messages).
             super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = ((long)(this->messages).
                   super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 4) *
            -0xf0f0f0f0f0f0f0f;
    if (this->messageIndex <= uVar9 && uVar9 - this->messageIndex != 0) {
      uVar10 = this->messageIndex;
      pMVar8 = pMVar8 + uVar10;
      do {
        if (lVar12 < (pMVar8->sendTime).internalTimeCode) break;
        uVar10 = uVar10 + 1;
        this->messageIndex = uVar10;
        pMVar8 = pMVar8 + 1;
      } while (uVar10 < uVar9);
    }
  }
  lVar12 = (this->nextPrintTimeStep).internalTimeCode;
  if (lVar12 < 1) {
    lVar12 = 0x7fffffffffffffff;
  }
  bVar14 = true;
  iteration = 0;
  iVar11 = 0;
  do {
    if (!bVar14) break;
    uVar9 = this->pointIndex;
    pVVar7 = (this->points).
             super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
             ._M_impl.super__Vector_impl_data._M_start;
    TVar13.internalTimeCode = 0x7fffffffffffffff;
    if (uVar9 < (ulong)((long)(this->points).
                              super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar7 >> 7)) {
      TVar13.internalTimeCode = pVVar7[uVar9].time.internalTimeCode;
      iVar11 = pVVar7[uVar9].iteration;
    }
    uVar9 = this->messageIndex;
    pMVar8 = (this->messages).
             super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = ((long)(this->messages).
                    super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 4) *
             -0xf0f0f0f0f0f0f0f;
    if (uVar9 <= uVar10 && uVar10 - uVar9 != 0) {
      lVar3 = pMVar8[uVar9].sendTime.internalTimeCode;
      if (lVar3 < TVar13.internalTimeCode) {
        TVar13.internalTimeCode = lVar3;
      }
      iVar11 = 0;
    }
    bVar5 = false;
    if (TVar13.internalTimeCode == 0x7fffffffffffffff) {
      bVar14 = false;
    }
    else {
      bVar5 = true;
      if (TVar13.internalTimeCode <= stopTime_input.internalTimeCode) {
        if (iVar11 != 0) {
          peVar2 = (this->super_App).fed.
                   super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          p_Var4 = (peVar2->super_ValueFederate)._vptr_ValueFederate[-3];
          if (TVar13.internalTimeCode <=
              *(long *)(&(peVar2->super_ValueFederate).field_0x28 + (long)p_Var4)) {
            Federate::requestTimeIterative
                      ((Federate *)
                       ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate + (long)p_Var4),
                       TVar13,FORCE_ITERATION);
            iteration = iteration + 1;
            sendInformation(this,TVar13,iteration);
            bVar5 = false;
            goto LAB_00186262;
          }
        }
        peVar2 = (this->super_App).fed.
                 super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        TVar13 = Federate::requestTime
                           ((Federate *)
                            ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                            (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),TVar13);
        sendInformation(this,TVar13,0);
        if (lVar12 <= TVar13.internalTimeCode) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"processed for time ",0x13);
          poVar6 = std::ostream::_M_insert<double>
                             ((double)(TVar13.internalTimeCode % 1000000000) * 1e-09 +
                              (double)(TVar13.internalTimeCode / 1000000000));
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          lVar12 = lVar12 + (this->nextPrintTimeStep).internalTimeCode;
        }
        bVar5 = false;
        iteration = 0;
      }
    }
LAB_00186262:
  } while (!bVar5);
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (peVar2->super_ValueFederate)._vptr_ValueFederate[-3];
  if (*(long *)(&(peVar2->super_ValueFederate).field_0x28 + (long)p_Var4) <
      stopTime_input.internalTimeCode) {
    this_00 = (Federate *)((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate + (long)p_Var4);
    do {
      Federate::requestTime(this_00,stopTime_input);
      peVar2 = (this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var4 = (peVar2->super_ValueFederate)._vptr_ValueFederate[-3];
      this_00 = (Federate *)
                ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate + (long)p_Var4);
    } while (*(long *)(&(peVar2->super_ValueFederate).field_0x28 + (long)p_Var4) <
             stopTime_input.internalTimeCode);
  }
  return;
}

Assistant:

void Player::runTo(Time stopTime_input)
{
    auto md = fed->getCurrentMode();
    if (md == Federate::Modes::STARTUP) {
        initialize();
    }
    if (md < Federate::Modes::EXECUTING) {
        sendInformation(-Time::epsilon());

        fed->enterExecutingMode();
        // send the stuff at timeZero
        sendInformation(timeZero);
    } else {
        auto ctime = fed->getCurrentTime();
        if (isValidIndex(pointIndex, points)) {
            while (points[pointIndex].time <= ctime) {
                ++pointIndex;
                if (pointIndex >= points.size()) {
                    break;
                }
            }
        }
        if (isValidIndex(messageIndex, messages)) {
            while (messages[messageIndex].sendTime <= ctime) {
                ++messageIndex;
                if (messageIndex >= messages.size()) {
                    break;
                }
            }
        }
    }

    Time nextPrintTime = (nextPrintTimeStep > timeZero) ? nextPrintTimeStep : Time::maxVal();
    bool moreToSend{true};
    int nextIteration{0};
    int currentIteration{0};
    while (moreToSend) {
        auto nextSendTime = Time::maxVal();
        if (isValidIndex(pointIndex, points)) {
            nextSendTime = std::min(nextSendTime, points[pointIndex].time);
            nextIteration = points[pointIndex].iteration;
        }
        if (isValidIndex(messageIndex, messages)) {
            nextSendTime = std::min(nextSendTime, messages[messageIndex].sendTime);
            nextIteration = 0;
        }
        if (nextSendTime == Time::maxVal()) {
            moreToSend = false;
            continue;
        }
        if (nextSendTime > stopTime_input) {
            break;
        }

        if ((nextIteration == 0) || (nextSendTime > fed->getCurrentTime())) {
            auto newTime = fed->requestTime(nextSendTime);
            currentIteration = 0;
            sendInformation(newTime, currentIteration);

            if (newTime >= nextPrintTime) {
                std::cout << "processed for time " << static_cast<double>(newTime) << "\n";
                nextPrintTime += nextPrintTimeStep;
            }
        } else {
            fed->requestTimeIterative(nextSendTime, IterationRequest::FORCE_ITERATION);
            ++currentIteration;
            sendInformation(nextSendTime, currentIteration);
        }
    }
    while (fed->getCurrentTime() < stopTime_input) {
        fed->requestTime(stopTime_input);
    }
}